

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleFilterCols_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  
  for (lVar1 = 0; iVar3 = x >> 0x10, (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    dst_ptr[lVar1] =
         (char)(((uint)src_ptr[(long)iVar3 + 1] - (uint)src_ptr[iVar3]) * ((uint)x >> 9 & 0x7f) +
                0x40 >> 7) + src_ptr[iVar3];
    uVar2 = x + dx;
    dst_ptr[lVar1 + 1] =
         (char)(((uint)src_ptr[(long)((int)uVar2 >> 0x10) + 1] - (uint)src_ptr[(int)uVar2 >> 0x10])
                * (uVar2 >> 9 & 0x7f) + 0x40 >> 7) + src_ptr[(int)uVar2 >> 0x10];
    x = uVar2 + dx;
  }
  if ((dst_width & 1U) != 0) {
    dst_ptr[lVar1] =
         (char)(((uint)src_ptr[(long)iVar3 + 1] - (uint)src_ptr[iVar3]) * ((uint)x >> 9 & 0x7f) +
                0x40 >> 7) + src_ptr[iVar3];
  }
  return;
}

Assistant:

void ScaleFilterCols_C(uint8_t* dst_ptr,
                       const uint8_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}